

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

float * drmp3__full_read_and_close_f32
                  (drmp3 *pMP3,drmp3_config *pConfig,drmp3_uint64 *pTotalFrameCount)

{
  uint uVar1;
  drmp3_uint64 dVar2;
  float *pfVar3;
  long *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  float *pNewFrames;
  drmp3_uint64 newFramesBufferSize;
  drmp3_uint64 framesJustRead;
  drmp3_uint64 framesToReadRightNow;
  float temp [4096];
  float *pFrames;
  drmp3_uint64 framesCapacity;
  drmp3_uint64 totalFramesRead;
  undefined1 local_4038 [16368];
  float *in_stack_ffffffffffffffb8;
  drmp3_uint64 in_stack_ffffffffffffffc0;
  drmp3 *in_stack_ffffffffffffffc8;
  float *local_30;
  ulong local_28;
  long local_20;
  
  local_20 = 0;
  local_28 = 0;
  local_30 = (float *)0x0;
  do {
    uVar1 = *(uint *)(in_RDI + 0x1a20);
    dVar2 = drmp3_read_pcm_frames_f32
                      (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                      );
    if (dVar2 == 0) break;
    pfVar3 = local_30;
    if (local_28 < local_20 + dVar2) {
      local_28 = local_28 << 1;
      if (local_28 < local_20 + dVar2) {
        local_28 = local_20 + dVar2;
      }
      pfVar3 = (float *)realloc(local_30,local_28 * *(uint *)(in_RDI + 0x1a20) * 4);
      if (pfVar3 == (float *)0x0) {
        drmp3_free((void *)0x108d25);
        break;
      }
    }
    local_30 = pfVar3;
    memcpy(local_30 + local_20 * (ulong)*(uint *)(in_RDI + 0x1a20),local_4038,
           dVar2 * *(uint *)(in_RDI + 0x1a20) * 4);
    local_20 = dVar2 + local_20;
  } while (dVar2 == SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(uVar1),0));
  if (in_RSI != (undefined4 *)0x0) {
    *in_RSI = *(undefined4 *)(in_RDI + 0x1a20);
    in_RSI[1] = *(undefined4 *)(in_RDI + 0x1a24);
  }
  drmp3_uninit((drmp3 *)0x108df5);
  if (in_RDX != (long *)0x0) {
    *in_RDX = local_20;
  }
  return local_30;
}

Assistant:

float* drmp3__full_read_and_close_f32(drmp3* pMP3, drmp3_config* pConfig, drmp3_uint64* pTotalFrameCount)
{
            drmp3_assert(pMP3 != NULL);

    drmp3_uint64 totalFramesRead = 0;
    drmp3_uint64 framesCapacity = 0;
    float* pFrames = NULL;

    float temp[4096];
    for (;;) {
        drmp3_uint64 framesToReadRightNow = drmp3_countof(temp) / pMP3->channels;
        drmp3_uint64 framesJustRead = drmp3_read_pcm_frames_f32(pMP3, framesToReadRightNow, temp);
        if (framesJustRead == 0) {
            break;
        }

        // Reallocate the output buffer if there's not enough room.
        if (framesCapacity < totalFramesRead + framesJustRead) {
            framesCapacity *= 2;
            if (framesCapacity < totalFramesRead + framesJustRead) {
                framesCapacity = totalFramesRead + framesJustRead;
            }

            drmp3_uint64 newFramesBufferSize = framesCapacity*pMP3->channels*sizeof(float);
            if (newFramesBufferSize > DRMP3_SIZE_MAX) {
                break;
            }

            float* pNewFrames = (float*)drmp3_realloc(pFrames, (size_t)newFramesBufferSize);
            if (pNewFrames == NULL) {
                drmp3_free(pFrames);
                break;
            }

            pFrames = pNewFrames;
        }

        drmp3_copy_memory(pFrames + totalFramesRead*pMP3->channels, temp, (size_t)(framesJustRead*pMP3->channels*sizeof(float)));
        totalFramesRead += framesJustRead;

        // If the number of frames we asked for is less that what we actually read it means we've reached the end.
        if (framesJustRead != framesToReadRightNow) {
            break;
        }
    }

    if (pConfig != NULL) {
        pConfig->outputChannels = pMP3->channels;
        pConfig->outputSampleRate = pMP3->sampleRate;
    }

    drmp3_uninit(pMP3);

    if (pTotalFrameCount) *pTotalFrameCount = totalFramesRead;
    return pFrames;
}